

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

void __thiscall File::executeParse(File *this)

{
  TSInput input;
  Snapshot *this_00;
  TSTree *pTVar1;
  vector<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
  chunks;
  TextBufferInput textBufferInput;
  undefined4 uStack_4c;
  vector<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
  local_48;
  vector<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
  *local_30;
  undefined8 local_28;
  undefined4 local_20;
  
  this_00 = TextBuffer::create_snapshot(&this->buffer);
  TextBuffer::Snapshot::primitive_chunks(&local_48,this_00);
  local_28 = 0;
  local_20 = 0;
  input._20_4_ = uStack_4c;
  input.encoding = 1;
  input.read = TextBufferInput::Read;
  input.payload = &local_30;
  local_30 = &local_48;
  pTVar1 = ts_parser_parse(this->parser,this->tree,input);
  this->tree = pTVar1;
  TextBuffer::Snapshot::~Snapshot(this_00);
  operator_delete(this_00,0x18);
  if (local_48.
      super__Vector_base<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void File::executeParse () {
    auto snapshot = buffer.create_snapshot(); // NOTE: Looks like this can be done without creating a snapshot

    auto chunks = snapshot->primitive_chunks();

    TextBufferInput textBufferInput { &chunks };

    tree = ts_parser_parse(parser, tree, textBufferInput.input());

//    std::cerr << "tree:\n";
//    std::cerr << ts_node_string(ts_tree_root_node(tree)) << "\n";

    delete snapshot;
}